

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void array_run_container_andnot
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  
  if (dst->capacity < src_1->cardinality) {
    array_container_grow(dst,src_1->cardinality,false);
  }
  iVar2 = src_2->n_runs;
  if ((long)iVar2 == 0) {
    memmove(dst->array,src_1->array,(long)src_1->cardinality * 2);
    iVar6 = src_1->cardinality;
  }
  else {
    iVar3 = src_1->cardinality;
    if (iVar3 < 1) {
      iVar6 = 0;
    }
    else {
      prVar4 = src_2->runs;
      uVar10 = (uint)prVar4->value;
      uVar9 = (uint)prVar4->length + (uint)prVar4->value;
      puVar5 = src_1->array;
      iVar7 = 0;
      iVar6 = 0;
      iVar8 = 0;
      do {
        uVar1 = puVar5[iVar7];
        if (uVar1 < uVar10) {
          lVar11 = (long)iVar6;
          iVar6 = iVar6 + 1;
          dst->array[lVar11] = uVar1;
        }
        else if (uVar9 < uVar1) {
          lVar11 = (long)iVar8;
          iVar12 = iVar8 + 1;
          if (iVar8 + 1 < iVar2) {
            iVar12 = iVar2;
          }
          do {
            lVar11 = lVar11 + 1;
            if (iVar2 <= lVar11) {
              uVar9 = 0x10001;
              uVar10 = 0x10001;
              iVar8 = iVar12 + -1;
              break;
            }
            uVar10 = (uint)prVar4[lVar11].value;
            uVar9 = prVar4[lVar11].length + uVar10;
            iVar8 = iVar8 + 1;
          } while (uVar9 < uVar1);
          iVar7 = iVar7 + -1;
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar3);
    }
  }
  dst->cardinality = iVar6;
  return;
}

Assistant:

void array_run_container_andnot(const array_container_t *src_1,
                                const run_container_t *src_2,
                                array_container_t *dst) {
    // basically following Java impl as of June 2016
    if (src_1->cardinality > dst->capacity) {
        array_container_grow(dst, src_1->cardinality, false);
    }

    if (src_2->n_runs == 0) {
        memmove(dst->array, src_1->array,
                sizeof(uint16_t) * src_1->cardinality);
        dst->cardinality = src_1->cardinality;
        return;
    }
    int32_t run_start = src_2->runs[0].value;
    int32_t run_end = run_start + src_2->runs[0].length;
    int which_run = 0;

    uint16_t val = 0;
    int dest_card = 0;
    for (int i = 0; i < src_1->cardinality; ++i) {
        val = src_1->array[i];
        if (val < run_start)
            dst->array[dest_card++] = val;
        else if (val <= run_end) {
            ;  // omitted item
        } else {
            do {
                if (which_run + 1 < src_2->n_runs) {
                    ++which_run;
                    run_start = src_2->runs[which_run].value;
                    run_end = run_start + src_2->runs[which_run].length;

                } else
                    run_start = run_end = (1 << 16) + 1;
            } while (val > run_end);
            --i;
        }
    }
    dst->cardinality = dest_card;
}